

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consuming_buffers.hpp
# Opt level: O2

void __thiscall
asio::detail::
consuming_buffers<asio::const_buffer,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>_>
::consume(consuming_buffers<asio::const_buffer,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>_>
          *this,size_t size)

{
  pointer pcVar1;
  difference_type __d;
  size_t sVar2;
  pointer pcVar3;
  size_t sVar4;
  ulong uVar5;
  
  this->total_consumed_ = this->total_consumed_ + size;
  pcVar1 = (this->buffers_).
           super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar2 = this->next_elem_;
  pcVar3 = (this->buffers_).
           super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>._M_impl.
           super__Vector_impl_data._M_start + sVar2;
  sVar4 = this->next_elem_offset_;
  while ((pcVar3 != pcVar1 && (size != 0))) {
    uVar5 = pcVar3->size_ - sVar4;
    if (pcVar3->size_ < sVar4) {
      uVar5 = 0;
    }
    if (size < uVar5) {
      sVar4 = sVar4 + size;
      size = 0;
    }
    else {
      sVar2 = sVar2 + 1;
      this->next_elem_ = sVar2;
      pcVar3 = pcVar3 + 1;
      sVar4 = 0;
      size = size - uVar5;
    }
    this->next_elem_offset_ = sVar4;
  }
  return;
}

Assistant:

void consume(std::size_t size)
  {
    total_consumed_ += size;

    Buffer_Iterator next = asio::buffer_sequence_begin(buffers_);
    Buffer_Iterator end = asio::buffer_sequence_end(buffers_);

    std::advance(next, next_elem_);
    while (next != end && size > 0)
    {
      Buffer next_buf = Buffer(*next) + next_elem_offset_;
      if (size < next_buf.size())
      {
        next_elem_offset_ += size;
        size = 0;
      }
      else
      {
        size -= next_buf.size();
        next_elem_offset_ = 0;
        ++next_elem_;
        ++next;
      }
    }
  }